

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall ieee754::is_zero(ieee754 *this)

{
  bool local_19;
  int i;
  int sum;
  ieee754 *this_local;
  
  sum = 0;
  for (i = 0; i < this->bytes + -1; i = i + 1) {
    sum = (uint)this->buf[i] + sum;
  }
  local_19 = false;
  if (sum == 0) {
    local_19 = (this->buf[this->bytes + -1] & 0x7f) == 0;
  }
  return (int)local_19;
}

Assistant:

int is_zero() const
    {
        /* 
         *   a zero is represented by all bits zero except possibly the sign
         *   bit, which is 0 for +0 and 1 for -0 
         */
        int sum = 0;
        for (int i = 0 ; i < bytes - 1 ; ++i)
            sum += buf[i];

        return sum == 0 && (buf[bytes-1] & 0x7f) == 0;
    }